

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O3

void __thiscall cppcms::impl::shared_mutex::unlock(shared_mutex *this)

{
  int iVar1;
  int *piVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->flock_ != (FILE *)0x0) {
    uStack_30 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 2;
    do {
      iVar1 = fileno((FILE *)this->flock_);
      iVar1 = fcntl(iVar1,7,&local_38);
      if (iVar1 == 0) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this->plock_);
  return;
}

Assistant:

void unlock()
		{
			if(flock_) {
				struct flock lock;
				memset(&lock,0,sizeof(lock));
				lock.l_type=F_UNLCK;
				lock.l_whence=SEEK_SET;
				while(::fcntl(fileno(flock_),F_SETLKW,&lock)!=0 && errno==EINTR)
					;
			}
			pthread_rwlock_unlock(plock_);
		}